

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ConcaveCornerOption __thiscall
ON_SubDFromMeshParameters::CopyConcaveCornerTest
          (ON_SubDFromMeshParameters *this,ON_SubDFromMeshParameters source_parameters)

{
  ConcaveCornerOption CVar1;
  uint minimum_concave_corner_edge_count;
  double minimum_concave_corner_angle_radians;
  ON_SubDFromMeshParameters *this_local;
  
  CVar1 = GetConcaveCornerOption(&source_parameters);
  SetConcaveCornerOption(this,CVar1);
  minimum_concave_corner_edge_count = MinimumConcaveCornerEdgeCount(&source_parameters);
  SetMinimumConcaveCornerEdgeCount(this,minimum_concave_corner_edge_count);
  minimum_concave_corner_angle_radians = MinimumConcaveCornerAngleRadians(&source_parameters);
  SetMinimumConcaveCornerAngleRadians(this,minimum_concave_corner_angle_radians);
  CVar1 = GetConcaveCornerOption(this);
  return CVar1;
}

Assistant:

ON_SubDFromMeshParameters::ConcaveCornerOption ON_SubDFromMeshParameters::CopyConcaveCornerTest(
  ON_SubDFromMeshParameters source_parameters
)
{
  SetConcaveCornerOption(source_parameters.GetConcaveCornerOption());
  SetMinimumConcaveCornerEdgeCount(source_parameters.MinimumConcaveCornerEdgeCount());
  SetMinimumConcaveCornerAngleRadians(source_parameters.MinimumConcaveCornerAngleRadians());
  return GetConcaveCornerOption();
}